

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader
          (LibraryKinematicsModelsLoader *this,IFilePartLoader *callingFilePartLoader)

{
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  FormulasLoader::FormulasLoader(&this->super_FormulasLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_0090d8c8;
  (this->super_FormulasLoader).super_HelperLoaderBase._vptr_HelperLoaderBase =
       (_func_int **)&PTR__LibraryKinematicsModelsLoader_0090da88;
  JointsLoader::JointsLoader(&this->mJointsLoader);
  TransformationLoader::TransformationLoader(&this->mTransformationLoader);
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mLinkStack).c.
  super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  this->mCurrentKinematicsModel = (KinematicsModel *)0x0;
  this->mCurrentJointInstance = (KinematicInstance *)0x0;
  std::_Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  ::_M_initialize_map((_Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
                       *)&this->mLinkStack,0);
  this->mCurrentAttachment = (KinematicAttachment *)0x0;
  (this->super_FormulasLoader).super_HelperLoaderBase.mHandlingFilePartLoader =
       &this->super_FilePartLoader;
  (this->mJointsLoader).super_HelperLoaderBase.mHandlingFilePartLoader = &this->super_FilePartLoader
  ;
  return;
}

Assistant:

LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader( IFilePartLoader* callingFilePartLoader )
		: FilePartLoader(callingFilePartLoader)
		, mCurrentKinematicsModel(0)
		, mCurrentJointInstance(0)
		, mCurrentAttachment(0)
	{
		FormulasLoader::setHandlingFilePartLoader(this);
		mJointsLoader.setHandlingFilePartLoader(this);
	}